

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mip_level::pack_to_dxt(mip_level *this,pixel_format fmt,bool cook,pack_params *p)

{
  int iVar1;
  image_u8 *img;
  image_u8 *pImage;
  image_u8 tmp_img;
  pack_params *p_local;
  bool cook_local;
  pixel_format fmt_local;
  mip_level *this_local;
  
  tmp_img.m_pixel_buf._8_8_ = p;
  iVar1 = pixel_format_helpers::is_dxt(fmt);
  if (iVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    image<crnlib::color_quad<unsigned_char,_int>_>::image
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImage);
    img = get_unpacked_image(this,(image<crnlib::color_quad<unsigned_char,_int>_> *)&pImage,1);
    this_local._7_1_ =
         pack_to_dxt(this,img,fmt,cook,(pack_params *)tmp_img.m_pixel_buf._8_8_,this->m_orient_flags
                    );
    image<crnlib::color_quad<unsigned_char,_int>_>::~image
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImage);
  }
  return this_local._7_1_;
}

Assistant:

bool mip_level::pack_to_dxt(pixel_format fmt, bool cook, const dxt_image::pack_params& p) {
  CRNLIB_ASSERT(pixel_format_helpers::is_dxt(fmt));
  if (!pixel_format_helpers::is_dxt(fmt))
    return false;

  image_u8 tmp_img;
  image_u8* pImage = get_unpacked_image(tmp_img, cUnpackFlagUncook);

  return pack_to_dxt(*pImage, fmt, cook, p, m_orient_flags);
}